

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O0

object_kind * lookup_kind(wchar_t tval,wchar_t sval)

{
  object_kind *poVar1;
  char *pcVar2;
  object_kind *kind;
  wchar_t k;
  wchar_t sval_local;
  wchar_t tval_local;
  
  kind._4_4_ = 0;
  while( true ) {
    if ((int)(uint)z_info->k_max <= kind._4_4_) {
      pcVar2 = tval_find_name(tval);
      msg("No object: %d:%d (%s)",(ulong)(uint)tval,(ulong)(uint)sval,pcVar2);
      return (object_kind *)0x0;
    }
    poVar1 = k_info + kind._4_4_;
    if ((poVar1->tval == tval) && (poVar1->sval == sval)) break;
    kind._4_4_ = kind._4_4_ + 1;
  }
  return poVar1;
}

Assistant:

struct object_kind *lookup_kind(int tval, int sval)
{
	int k;

	/* Look for it */
	for (k = 0; k < z_info->k_max; k++) {
		struct object_kind *kind = &k_info[k];
		if (kind->tval == tval && kind->sval == sval)
			return kind;
	}

	/* Failure */
	msg("No object: %d:%d (%s)", tval, sval, tval_find_name(tval));
	return NULL;
}